

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O0

Tru_Man_t * Tru_ManAlloc(int nVars)

{
  int iVar1;
  Tru_Man_t *p_00;
  int *piVar2;
  Vec_Set_t *pVVar3;
  word *pwVar4;
  int local_5c;
  uint local_58;
  int local_54;
  int w;
  int i;
  Tru_Man_t *p;
  word Masks [6];
  int nVars_local;
  
  memset(&p,0,0x30);
  p = (Tru_Man_t *)0xaaaaaaaaaaaaaaaa;
  Masks[0] = 0xcccccccccccccccc;
  Masks[1] = 0xf0f0f0f0f0f0f0f0;
  Masks[2] = 0xff00ff00ff00ff00;
  Masks[3] = 0xffff0000ffff0000;
  Masks[4] = 0xffffffff00000000;
  if ((0 < nVars) && (nVars < 0x11)) {
    p_00 = (Tru_Man_t *)calloc(1,0x70);
    p_00->nVars = nVars;
    if (nVars < 6) {
      local_5c = 1;
    }
    else {
      local_5c = 1 << ((char)nVars - 6U & 0x1f);
    }
    p_00->nWords = local_5c;
    p_00->nEntrySize = (int)((long)p_00->nWords * 8 + 8U >> 2);
    p_00->nTableSize = 0x1fd3;
    piVar2 = (int *)calloc((long)p_00->nTableSize,4);
    p_00->pTable = piVar2;
    pVVar3 = Vec_SetAlloc(0x10);
    p_00->pMem = pVVar3;
    pwVar4 = (word *)malloc((long)p_00->nWords << 3);
    p_00->pZero = pwVar4;
    local_54 = 0;
    while( true ) {
      if (nVars <= local_54) {
        Tru_ManClear(p_00->pZero,p_00->nWords);
        return p_00;
      }
      for (local_58 = 0; (int)local_58 < p_00->nWords; local_58 = local_58 + 1) {
        if (local_54 < 6) {
          p_00->pZero[(int)local_58] = Masks[(long)local_54 + -1];
        }
        else if ((local_58 & 1 << ((char)local_54 - 6U & 0x1f)) == 0) {
          p_00->pZero[(int)local_58] = 0;
        }
        else {
          p_00->pZero[(int)local_58] = 0xffffffffffffffff;
        }
      }
      iVar1 = Tru_ManInsert(p_00,p_00->pZero);
      p_00->hIthVars[local_54] = iVar1;
      if ((local_54 != 0) && (p_00->hIthVars[local_54] <= p_00->hIthVars[local_54 + -1])) break;
      local_54 = local_54 + 1;
    }
    __assert_fail("!i || p->hIthVars[i] > p->hIthVars[i-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                  ,0xe7,"Tru_Man_t *Tru_ManAlloc(int)");
  }
  __assert_fail("nVars > 0 && nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                ,0xd3,"Tru_Man_t *Tru_ManAlloc(int)");
}

Assistant:

Tru_Man_t * Tru_ManAlloc( int nVars )
{
    word Masks[6] = 
    { 
        ABC_CONST(0xAAAAAAAAAAAAAAAA), 
        ABC_CONST(0xCCCCCCCCCCCCCCCC), 
        ABC_CONST(0xF0F0F0F0F0F0F0F0), 
        ABC_CONST(0xFF00FF00FF00FF00), 
        ABC_CONST(0xFFFF0000FFFF0000), 
        ABC_CONST(0xFFFFFFFF00000000) 
    };
    Tru_Man_t * p;
    int i, w;
    assert( nVars > 0 && nVars <= 16 );
    p = ABC_CALLOC( Tru_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = (nVars < 6) ? 1 : (1 << (nVars-6));
    p->nEntrySize = (sizeof(Tru_One_t) + p->nWords * sizeof(word))/sizeof(int);
    p->nTableSize = 8147;
    p->pTable     = ABC_CALLOC( int, p->nTableSize );
    p->pMem       = Vec_SetAlloc( 16 );
    // initialize truth tables
    p->pZero = ABC_ALLOC( word, p->nWords );
    for ( i = 0; i < nVars; i++ )
    {
        for ( w = 0; w < p->nWords; w++ )
            if ( i < 6 )
                p->pZero[w] = Masks[i];
            else if ( w & (1 << (i-6)) )
                p->pZero[w] = ~(word)0;
            else
                p->pZero[w] = 0;
        p->hIthVars[i] = Tru_ManInsert( p, p->pZero );
        assert( !i || p->hIthVars[i] > p->hIthVars[i-1] );
    }
    Tru_ManClear( p->pZero, p->nWords );
    return p;
}